

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

x86_reg X86_insn_reg_att(uint id,cs_ac_type *access)

{
  uint i;
  cs_ac_type *access_local;
  uint id_local;
  
  i = 0;
  while( true ) {
    if (0x65 < i) {
      return X86_REG_INVALID;
    }
    if (insn_regs_att[i].insn == id) break;
    i = i + 1;
  }
  if (access != (cs_ac_type *)0x0) {
    *access = insn_regs_att[i].access;
  }
  return insn_regs_att[i].reg;
}

Assistant:

x86_reg X86_insn_reg_att(unsigned int id, enum cs_ac_type *access)
{
	unsigned int i;

	for (i = 0; i < ARR_SIZE(insn_regs_att); i++) {
		if (insn_regs_att[i].insn == id) {
			if (access)
				*access = insn_regs_att[i].access;
			return insn_regs_att[i].reg;
		}
	}

	// not found
	return 0;
}